

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voprf.cc
# Opt level: O1

int dleq_generate(VOPRF_METHOD *method,CBB *cbb,TRUST_TOKEN_ISSUER_KEY *priv,EC_JACOBIAN *T,
                 EC_JACOBIAN *W)

{
  int iVar1;
  EC_GROUP *group;
  EC_SCALAR r;
  EC_SCALAR u;
  EC_SCALAR c;
  EC_SCALAR c_mont;
  EC_AFFINE affines [4];
  EC_JACOBIAN jacobians [4];
  EC_SCALAR aEStack_6f8 [12];
  undefined1 local_398 [432];
  EC_JACOBIAN local_1e8;
  EC_JACOBIAN local_110;
  
  group = (*voprf_exp2_method.group_func)();
  iVar1 = ec_random_nonzero_scalar(group,aEStack_6f8,"");
  if (iVar1 != 0) {
    iVar1 = ec_point_mul_scalar_base(group,&local_1e8,aEStack_6f8);
    if (iVar1 != 0) {
      iVar1 = ec_point_mul_scalar(group,&local_110,(EC_JACOBIAN *)priv,aEStack_6f8);
      if (iVar1 != 0) {
        memcpy(local_398,priv,0xd8);
      }
    }
  }
  return 0;
}

Assistant:

static int dleq_generate(const VOPRF_METHOD *method, CBB *cbb,
                         const TRUST_TOKEN_ISSUER_KEY *priv,
                         const EC_JACOBIAN *T, const EC_JACOBIAN *W) {
  const EC_GROUP *group = method->group_func();

  enum {
    idx_T,
    idx_W,
    idx_k0,
    idx_k1,
    num_idx,
  };
  EC_JACOBIAN jacobians[num_idx];

  // Setup the DLEQ proof.
  EC_SCALAR r;
  if (  // r <- Zp
      !ec_random_nonzero_scalar(group, &r, kDefaultAdditionalData) ||
      // k0;k1 = r*(G;T)
      !ec_point_mul_scalar_base(group, &jacobians[idx_k0], &r) ||
      !ec_point_mul_scalar(group, &jacobians[idx_k1], T, &r)) {
    return 0;
  }

  EC_AFFINE affines[num_idx];
  jacobians[idx_T] = *T;
  jacobians[idx_W] = *W;
  if (!ec_jacobian_to_affine_batch(group, affines, jacobians, num_idx)) {
    return 0;
  }

  // Compute c = Hc(...).
  EC_SCALAR c;
  if (!hash_to_scalar_dleq(method, &c, &priv->pubs, &affines[idx_T],
                           &affines[idx_W], &affines[idx_k0],
                           &affines[idx_k1])) {
    return 0;
  }


  EC_SCALAR c_mont;
  ec_scalar_to_montgomery(group, &c_mont, &c);

  // u = r + c*xs
  EC_SCALAR u;
  ec_scalar_mul_montgomery(group, &u, &priv->xs, &c_mont);
  ec_scalar_add(group, &u, &r, &u);

  // Store DLEQ proof in transcript.
  if (!scalar_to_cbb(cbb, group, &c) || !scalar_to_cbb(cbb, group, &u)) {
    return 0;
  }

  return 1;
}